

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int nn_socket(int domain,int protocol)

{
  short *psVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  char *pcVar5;
  nn_sock **ppnVar6;
  nn_transport *pnVar7;
  nn_socktype **ppnVar8;
  int *piVar9;
  nn_sock *self;
  uint fd;
  nn_transport **ppnVar10;
  nn_socktype *socktype;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  
  nn_do_once(&once,nn_lib_init);
  nn_mutex_lock(&::self.lock);
  if ((::self.flags & 3U) == 0) {
    if (::self.socks == (nn_sock **)0x0) {
      nn_alloc_init();
      nn_random_seed();
      ::self.socks = (nn_sock **)nn_alloc_(0x1400);
      if (::self.socks == (nn_sock **)0x0) {
        nn_socket_cold_2();
      }
      lVar4 = 0;
      do {
        ::self.socks[lVar4] = (nn_sock *)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x200);
      ::self.nsocks = 0;
      ::self.flags = 0;
      pcVar5 = getenv("NN_PRINT_ERRORS");
      auVar2 = _DAT_001b5380;
      ::self.print_errors = 0;
      if (pcVar5 != (char *)0x0) {
        ::self.print_errors = (int)(*pcVar5 != '\0');
      }
      ppnVar6 = ::self.socks + 0x200;
      sVar11 = 0;
      sVar12 = 1;
      sVar13 = 2;
      sVar14 = 3;
      sVar15 = 4;
      sVar16 = 5;
      sVar17 = 6;
      sVar18 = 7;
      lVar4 = 0;
      ::self.unused = (uint16_t *)ppnVar6;
      do {
        psVar1 = (short *)((long)ppnVar6 + lVar4 * 2);
        *psVar1 = auVar2._0_2_ - sVar11;
        psVar1[1] = auVar2._2_2_ - sVar12;
        psVar1[2] = auVar2._4_2_ - sVar13;
        psVar1[3] = auVar2._6_2_ - sVar14;
        psVar1[4] = auVar2._8_2_ - sVar15;
        psVar1[5] = auVar2._10_2_ - sVar16;
        psVar1[6] = auVar2._12_2_ - sVar17;
        psVar1[7] = auVar2._14_2_ - sVar18;
        lVar4 = lVar4 + 8;
        sVar11 = sVar11 + 8;
        sVar12 = sVar12 + 8;
        sVar13 = sVar13 + 8;
        sVar14 = sVar14 + 8;
        sVar15 = sVar15 + 8;
        sVar16 = sVar16 + 8;
        sVar17 = sVar17 + 8;
        sVar18 = sVar18 + 8;
      } while (lVar4 != 0x200);
      if (nn_transports[0] != (nn_transport *)0x0) {
        ppnVar10 = nn_transports;
        pnVar7 = nn_transports[0];
        do {
          ppnVar10 = ppnVar10 + 1;
          if (pnVar7->init != (_func_void *)0x0) {
            (*pnVar7->init)();
          }
          pnVar7 = *ppnVar10;
        } while (pnVar7 != (nn_transport *)0x0);
      }
      nn_pool_init(&::self.pool);
    }
    uVar3 = 0xffffff9f;
    if ((0xfffffffd < domain - 3U) && (uVar3 = 0xffffffe8, ::self.nsocks < 0x200)) {
      if (nn_socktypes[0] != (nn_socktype *)0x0) {
        fd = (uint)*(ushort *)
                    ((long)::self.unused + (ulong)(uint)((0x1ff - (int)::self.nsocks) * 2));
        ppnVar8 = nn_socktypes;
        socktype = nn_socktypes[0];
        do {
          ppnVar8 = ppnVar8 + 1;
          if ((socktype->domain == domain) && (socktype->protocol == protocol)) {
            self = (nn_sock *)nn_alloc_(0x250);
            if (self == (nn_sock *)0x0) {
              uVar3 = 0xfffffff4;
            }
            else {
              uVar3 = nn_sock_init(self,socktype,fd);
              if (-1 < (int)uVar3) {
                ::self.socks[fd] = self;
                ::self.nsocks = ::self.nsocks + 1;
                uVar3 = fd;
              }
            }
            goto LAB_0019e892;
          }
          socktype = *ppnVar8;
        } while (socktype != (nn_socktype *)0x0);
      }
      uVar3 = 0xffffffea;
    }
LAB_0019e892:
    if (-1 < (int)uVar3) {
      nn_mutex_unlock(&::self.lock);
      return uVar3;
    }
    nn_global_term();
    nn_mutex_unlock(&::self.lock);
    piVar9 = __errno_location();
    *piVar9 = -uVar3;
  }
  else {
    nn_socket_cold_1();
  }
  return -1;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_do_once (&once, nn_lib_init);

    nn_mutex_lock (&self.lock);

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_TERM)) {
        nn_mutex_unlock (&self.lock);
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_mutex_unlock (&self.lock);
        errno = -rc;
        return -1;
    }

    nn_mutex_unlock (&self.lock);

    return rc;
}